

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_bin
          (int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<wchar_t> *spec;
  bool bVar3;
  bin_writer<1> f;
  int num_digits;
  unsigned_type uVar4;
  string_view prefix;
  undefined4 uStack_4;
  
  spec = this->spec;
  if (((spec->super_core_format_specs).flags & 8) != 0) {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = (spec->super_core_format_specs).type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = 0;
  uVar4 = this->abs_value;
  do {
    num_digits = num_digits + 1;
    bVar3 = 1 < uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar3);
  prefix.data_ = this->prefix;
  f._12_4_ = uStack_4;
  f.num_digits = num_digits;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
  ::
  write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              *)this->writer,num_digits,prefix,spec,f);
  return;
}

Assistant:

void on_bin() {
      if (spec.has(HASH_FLAG)) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(spec.type);
      }
      int num_digits = count_digits<1>();
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<1>{abs_value, num_digits});
    }